

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall Fad<Fad<double>_>::Fad(Fad<Fad<double>_> *this,int sz,Fad<double> *x)

{
  uint uVar1;
  MEM_CPY<double> *this_00;
  ulong uVar2;
  Fad<double> local_40;
  
  (this->val_).val_ = x->val_;
  uVar1 = (x->dx_).num_elts;
  (this->val_).dx_.num_elts = uVar1;
  (this->val_).dx_.ptr_to_data = (double *)0x0;
  if ((long)(int)uVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar2 = (long)(int)uVar1 << 3;
    }
    this_00 = (MEM_CPY<double> *)operator_new__(uVar2);
    (this->val_).dx_.ptr_to_data = (double *)this_00;
    MEM_CPY<double>::copy(this_00,(EVP_PKEY_CTX *)(x->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1)
    ;
  }
  (this->val_).defaultVal = x->defaultVal;
  local_40.val_ = 0.0;
  local_40.dx_.num_elts = 0;
  local_40.dx_.ptr_to_data = (double *)0x0;
  local_40.defaultVal = 0.0;
  Vector<Fad<double>_>::Vector(&this->dx_,sz,&local_40);
  Fad<double>::~Fad(&local_40);
  (this->defaultVal).val_ = 0.0;
  (this->defaultVal).dx_.num_elts = 0;
  (this->defaultVal).dx_.ptr_to_data = (double *)0x0;
  (this->defaultVal).defaultVal = 0.0;
  return;
}

Assistant:

Fad(const int sz, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0)) {;}